

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

SpecialProperties Catch::parseSpecialTag(string *tag)

{
  bool bVar1;
  string *tag_local;
  
  bVar1 = std::operator==(tag,".");
  if (((bVar1) || (bVar1 = std::operator==(tag,"hide"), bVar1)) ||
     (bVar1 = std::operator==(tag,"!hide"), bVar1)) {
    return IsHidden;
  }
  bVar1 = std::operator==(tag,"!throws");
  if (bVar1) {
    return Throws;
  }
  bVar1 = std::operator==(tag,"!shouldfail");
  if (!bVar1) {
    bVar1 = std::operator==(tag,"!mayfail");
    if (!bVar1) {
      return None;
    }
    return MayFail;
  }
  return ShouldFail;
}

Assistant:

inline TestCaseInfo::SpecialProperties parseSpecialTag( std::string const& tag ) {
        if( tag == "." ||
            tag == "hide" ||
            tag == "!hide" )
            return TestCaseInfo::IsHidden;
        else if( tag == "!throws" )
            return TestCaseInfo::Throws;
        else if( tag == "!shouldfail" )
            return TestCaseInfo::ShouldFail;
        else if( tag == "!mayfail" )
            return TestCaseInfo::MayFail;
        else
            return TestCaseInfo::None;
    }